

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grant_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::GrantMessageTest_test_to_string_Test::TestBody
          (GrantMessageTest_test_to_string_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_60;
  Message local_58 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  GrantMessageTest_test_to_string_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  bidfx_public_api::price::pixie::GrantMessage::ToString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[29],std::__cxx11::string>
            ((EqHelper<false> *)local_20,"\"Grant(granted=true, reason=)\"",
             "access_granted.ToString()",(char (*) [29])"Grant(granted=true, reason=)",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/grant_message_test.cpp"
               ,0x5f,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(GrantMessageTest, test_to_string)
{
    ASSERT_EQ("Grant(granted=true, reason=)", access_granted.ToString());
}